

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          string *linkLibs,string *flags,string *linkFlags,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *target)

{
  cmOutputConverter *this_00;
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmMakefile *pcVar4;
  char *pcVar5;
  cmSourceFile *this_01;
  bool bVar6;
  TargetType TVar7;
  int iVar8;
  long *plVar9;
  char *__s;
  string *psVar10;
  undefined8 *puVar11;
  ulong *puVar12;
  pointer *pppcVar13;
  undefined8 uVar14;
  pointer ppcVar15;
  char *pcVar16;
  char *__end;
  string configLinkFlags;
  string buildType;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string linkLanguage;
  string local_118;
  cmLocalGenerator *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  cmComputeLinkInformation *local_90;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_88;
  string local_68;
  string *local_48;
  cmLinkLineComputer *local_40;
  string *local_38;
  
  local_f8 = this;
  cmsys::SystemTools::UpperCase(&local_b0,config);
  local_90 = cmGeneratorTarget::GetLinkInformation(target,config);
  local_40 = linkLineComputer;
  local_38 = linkLibs;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(&local_68,linkLineComputer,target,&local_b0);
  TVar7 = cmGeneratorTarget::GetType(target);
  switch(TVar7) {
  case EXECUTABLE:
    pcVar4 = local_f8->Makefile;
    paVar2 = &local_118.field_2;
    local_118._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"CMAKE_EXE_LINKER_FLAGS","");
    cmMakefile::GetSafeDefinition(pcVar4,&local_118);
    std::__cxx11::string::append((char *)linkFlags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    if (local_b0._M_string_length != 0) {
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"CMAKE_EXE_LINKER_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b0._M_dataplus._M_p);
      cmMakefile::GetSafeDefinition(local_f8->Makefile,&local_118);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_68._M_string_length == 0) {
      psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      cmSystemTools::Error
                ("CMake can not determine linker language for target: ",(psVar10->_M_dataplus)._M_p,
                 (char *)0x0,(char *)0x0);
      goto LAB_002d08ba;
    }
    AddLanguageFlagsForLinking(local_f8,flags,target,&local_68,&local_b0);
    if (local_90 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(local_f8,local_90,local_40,local_38,frameworkPath,linkPath);
    }
    pcVar4 = local_f8->Makefile;
    local_118._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"BUILD_SHARED_LIBS","");
    pcVar16 = cmMakefile::GetDefinition(pcVar4,&local_118);
    bVar6 = cmSystemTools::IsOn(pcVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CMAKE_SHARED_BUILD_","");
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d0,(ulong)local_68._M_dataplus._M_p);
      paVar3 = &local_f0.field_2;
      puVar12 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_f0.field_2._M_allocated_capacity = *puVar12;
        local_f0.field_2._8_4_ = (undefined4)plVar9[3];
        local_f0.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
        local_f0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *puVar12;
        local_f0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_f0._M_string_length = plVar9[1];
      *plVar9 = (long)puVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      pppcVar13 = &local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pppcVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"_FLAGS","");
      uVar14 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar3) {
        uVar14 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 <
          (pointer)((long)local_88.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish + local_f0._M_string_length)) {
        ppcVar15 = (pointer)0xf;
        if (local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)pppcVar13) {
          ppcVar15 = local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        if (ppcVar15 <
            (pointer)((long)local_88.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish + local_f0._M_string_length))
        goto LAB_002d0501;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_88,0,(char *)0x0,(ulong)local_f0._M_dataplus._M_p);
      }
      else {
LAB_002d0501:
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_f0,
                             (ulong)local_88.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      }
      psVar1 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_118.field_2._M_allocated_capacity = *psVar1;
        local_118.field_2._8_8_ = puVar11[3];
        local_118._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar1;
        local_118._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_118._M_string_length = puVar11[1];
      *puVar11 = psVar1;
      puVar11[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)pppcVar13) {
        operator_delete(local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar3) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::GetSafeDefinition(local_f8->Makefile,&local_118);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    local_118._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"WIN32_EXECUTABLE","");
    bVar6 = cmGeneratorTarget::GetPropertyAsBool(target,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = local_f8->Makefile;
    if (bVar6) {
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"CMAKE_CREATE_WIN32_EXE","");
      cmMakefile::GetSafeDefinition(pcVar4,&local_118);
      std::__cxx11::string::append((char *)linkFlags);
    }
    else {
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"CMAKE_CREATE_CONSOLE_EXE","");
      cmMakefile::GetSafeDefinition(pcVar4,&local_118);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    bVar6 = cmGeneratorTarget::IsExecutableWithExports(target);
    if (bVar6) {
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"CMAKE_EXE_EXPORTS_","");
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_68._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_118);
      cmMakefile::GetSafeDefinition(local_f8->Makefile,&local_118);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    GetLinkLibsCMP0065(&local_118,local_f8,&local_68,target);
    if (local_118._M_string_length != 0) {
      std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_118._M_dataplus._M_p);
      std::__cxx11::string::append((char *)linkFlags);
    }
    paVar3 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"LINK_FLAGS","");
    pcVar16 = cmGeneratorTarget::GetProperty(target,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar3) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (pcVar16 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_b0._M_string_length != 0) {
      local_f0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"LINK_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_b0._M_dataplus._M_p);
      pcVar16 = cmGeneratorTarget::GetProperty(target,&local_f0);
      if (pcVar16 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar3) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    break;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags(local_f8,linkFlags,&local_b0,target);
    break;
  case SHARED_LIBRARY:
    pcVar16 = "CMAKE_SHARED_LINKER_FLAGS";
    goto LAB_002cff19;
  case MODULE_LIBRARY:
    pcVar16 = "CMAKE_MODULE_LINKER_FLAGS";
LAB_002cff19:
    pcVar4 = local_f8->Makefile;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_48 = config;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,pcVar16,pcVar16 + 0x19);
    __s = cmMakefile::GetSafeDefinition(pcVar4,&local_118);
    pcVar5 = (char *)linkFlags->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)linkFlags,0,pcVar5,(ulong)__s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)linkFlags);
    config = local_48;
    if (local_b0._M_string_length != 0) {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,pcVar16,pcVar16 + 0x19);
      std::__cxx11::string::append((char *)&local_118);
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b0._M_dataplus._M_p);
      cmMakefile::GetSafeDefinition(local_f8->Makefile,&local_118);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar4 = local_f8->Makefile;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"WIN32","");
    bVar6 = cmMakefile::IsOn(pcVar4,&local_118);
    if (bVar6) {
      pcVar4 = local_f8->Makefile;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CYGWIN","");
      bVar6 = cmMakefile::IsOn(pcVar4,&local_f0);
      if (bVar6) {
        bVar6 = false;
      }
      else {
        pcVar4 = local_f8->Makefile;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"MINGW","");
        bVar6 = cmMakefile::IsOn(pcVar4,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        bVar6 = !bVar6;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetSourceFiles(target,&local_88,&local_b0);
      pcVar4 = local_f8->Makefile;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"CMAKE_LINK_DEF_FILE_FLAG","");
      pcVar16 = cmMakefile::GetSafeDefinition(pcVar4,&local_f0);
      std::__cxx11::string::string((string *)&local_118,pcVar16,(allocator *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = &local_f8->super_cmOutputConverter;
        pppcVar13 = (pointer *)
                    local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        do {
          this_01 = (cmSourceFile *)*pppcVar13;
          psVar10 = cmSourceFile::GetExtension_abi_cxx11_(this_01);
          iVar8 = std::__cxx11::string::compare((char *)psVar10);
          if (iVar8 == 0) {
            std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_118._M_dataplus._M_p);
            psVar10 = cmSourceFile::GetFullPath(this_01,(string *)0x0);
            cmsys::SystemTools::CollapseFullPath(&local_d0,psVar10);
            cmOutputConverter::ConvertToOutputFormat(&local_f0,this_00,&local_d0,SHELL);
            std::__cxx11::string::_M_append((char *)linkFlags,(ulong)local_f0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)linkFlags);
          }
          pppcVar13 = pppcVar13 + 1;
        } while ((pointer)pppcVar13 !=
                 local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      config = local_48;
      if (local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"LINK_FLAGS","");
    pcVar16 = cmGeneratorTarget::GetProperty(target,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (pcVar16 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    if (local_b0._M_string_length != 0) {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"LINK_FLAGS_","");
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_b0._M_dataplus._M_p);
      pcVar16 = cmGeneratorTarget::GetProperty(target,&local_118);
      if (pcVar16 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_90 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(local_f8,local_90,local_40,local_38,frameworkPath,linkPath);
    }
  }
  AppendIPOLinkerFlags(local_f8,linkFlags,target,config,&local_68);
LAB_002d08ba:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::string& linkLibs, std::string& flags, std::string& linkFlags,
  std::string& frameworkPath, std::string& linkPath, cmGeneratorTarget* target)
{
  const std::string buildType = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, buildType);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
      linkFlags += " ";
      if (!buildType.empty()) {
        std::string build = libraryLinkVariable;
        build += "_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
      }
      if (this->Makefile->IsOn("WIN32") &&
          !(this->Makefile->IsOn("CYGWIN") || this->Makefile->IsOn("MINGW"))) {
        std::vector<cmSourceFile*> sources;
        target->GetSourceFiles(sources, buildType);
        std::string defFlag =
          this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
        for (std::vector<cmSourceFile*>::const_iterator i = sources.begin();
             i != sources.end(); ++i) {
          cmSourceFile* sf = *i;
          if (sf->GetExtension() == "def") {
            linkFlags += defFlag;
            linkFlags += this->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(sf->GetFullPath()), SHELL);
            linkFlags += " ";
          }
        }
      }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      linkFlags += this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
      linkFlags += " ";
      if (!buildType.empty()) {
        std::string build = "CMAKE_EXE_LINKER_FLAGS_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
      }
      if (linkLanguage.empty()) {
        cmSystemTools::Error(
          "CMake can not determine linker language for target: ",
          target->GetName().c_str());
        return;
      }
      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, buildType);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
      if (cmSystemTools::IsOn(
            this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_") +
          linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
      }
      if (target->GetPropertyAsBool("WIN32_EXECUTABLE")) {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
        linkFlags += " ";
      } else {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
        linkFlags += " ";
      }
      if (target->IsExecutableWithExports()) {
        std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
        exportFlagVar += linkLanguage;
        exportFlagVar += "_FLAG";

        linkFlags += this->Makefile->GetSafeDefinition(exportFlagVar);
        linkFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        linkFlags += cmp0065Flags;
        linkFlags += " ";
      }

      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
      }
      if (!buildType.empty()) {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if (targetLinkFlags) {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
        }
      }
    } break;
    default:
      break;
  }

  this->AppendIPOLinkerFlags(linkFlags, target, config, linkLanguage);
}